

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void groupConcatValue(sqlite3_context *context)

{
  void *pvVar1;
  ulong uVar2;
  _func_void_void_ptr *xDel;
  int n;
  char *z;
  
  pvVar1 = sqlite3_aggregate_context(context,0);
  if (pvVar1 == (void *)0x0) {
    return;
  }
  if (*(char *)((long)pvVar1 + 0x1c) == '\a') {
    sqlite3_result_error_nomem(context);
    return;
  }
  if (*(char *)((long)pvVar1 + 0x1c) == '\x12') {
    sqlite3_result_error_toobig(context);
    return;
  }
  uVar2 = (ulong)*(uint *)((long)pvVar1 + 0x18);
  if (*(int *)((long)pvVar1 + 0x20) < 1) {
    if (uVar2 != 0) goto LAB_0019c31f;
    n = 0;
    z = (char *)0x0;
  }
  else {
    if (uVar2 == 0) {
      z = "";
      n = 1;
      xDel = (_func_void_void_ptr *)0x0;
      goto LAB_0019c334;
    }
LAB_0019c31f:
    *(undefined1 *)(*(long *)((long)pvVar1 + 8) + uVar2) = 0;
    z = *(char **)((long)pvVar1 + 8);
    n = *(int *)((long)pvVar1 + 0x18);
  }
  xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_0019c334:
  sqlite3_result_text(context,z,n,xDel);
  return;
}

Assistant:

static void groupConcatValue(sqlite3_context *context){
  GroupConcatCtx *pGCC
    = (GroupConcatCtx*)sqlite3_aggregate_context(context, 0);
  if( pGCC ){
    StrAccum *pAccum = &pGCC->str;
    if( pAccum->accError==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==SQLITE_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else if( pGCC->nAccum>0 && pAccum->nChar==0 ){
      sqlite3_result_text(context, "", 1, SQLITE_STATIC);
    }else{
      const char *zText = sqlite3_str_value(pAccum);
      sqlite3_result_text(context, zText, pAccum->nChar, SQLITE_TRANSIENT);
    }
  }
}